

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game_server.c
# Opt level: O2

int start_game(void)

{
  int iVar1;
  __pid_t _Var2;
  PIPE *pipes_00;
  ssize_t sVar3;
  char *__s;
  long lVar4;
  int game_pipe [2];
  char msg [4096];
  PIPE pipes [20];
  
  puts("Start game server...");
  for (lVar4 = 0; lVar4 != 0x1270; lVar4 = lVar4 + 0xec) {
    pipe((int *)((long)pipes[0].pipe + lVar4));
    (pipes[0].name + lVar4 + -1)[0] = '\0';
    (pipes[0].name + lVar4 + -1)[1] = '\0';
    *(undefined8 *)((long)pipes[0].score + lVar4 + -4) = 0;
    *(undefined8 *)((long)pipes[0].score + lVar4 + 4) = 0;
    *(undefined8 *)((long)pipes[0].score + lVar4 + 0xc) = 0;
    *(undefined8 *)((long)pipes[0].score + lVar4 + 0x14) = 0;
    *(undefined8 *)((long)pipes[0].score + lVar4 + 0x1c) = 0;
    *(undefined8 *)((long)pipes[0].score + lVar4 + 0x24) = 0;
    *(undefined8 *)((long)pipes[0].score + lVar4 + 0x2a) = 0;
  }
  iVar1 = shmget(0,0x1270,0x7a0);
  if (iVar1 == -1) {
    __s = "Sharing memory cannot been created!";
  }
  else {
    pipes_00 = (PIPE *)shmat(iVar1,(void *)0x0,0);
    if (pipes_00 == (PIPE *)0xffffffffffffffff) {
      __s = "Cannot link sharing memory to this process!(Game server)";
    }
    else {
      memcpy(pipes_00,pipes,0x1270);
      pipe(game_pipe);
      _Var2 = fork();
      if (_Var2 == 0) {
        iVar1 = start_websocket(0x2382,iVar1,game_pipe[1]);
        if (iVar1 == -1) {
          __s = "Websocket server start failure!";
          goto LAB_00103d7a;
        }
      }
      while( true ) {
        memset(msg,0,0x1000);
        sVar3 = read(game_pipe[0],msg,0x1000);
        if (sVar3 < 1) break;
        iVar1 = deal_info(msg,pipes_00);
        if (iVar1 == -1) {
          printf("The info:%s is illegal!\n");
        }
      }
      __s = "Pipe between webSocket and Game server is broken!";
    }
  }
LAB_00103d7a:
  puts(__s);
  return -1;
}

Assistant:

int start_game(){
    printf("Start game server...\n");
    int game_infor[64];

    struct PIPE pipes[MAX_USER];
    for(int i = 0; i < MAX_USER; i++){
        //pipes[i]= (struct PIPE *)malloc(sizeof(struct PIPE));
        pipe(pipes[i].pipe);
        pipes[i].useState = false;
        pipes[i].level = 0;
        memset(pipes[i].score, 0 ,MAX_SONG);
        strcpy(pipes[i].name, "");
    }

    int shm_id;
    struct PIPE *shared = NULL;
    if((shm_id = shmget(IPC_PRIVATE, sizeof(struct PIPE) * MAX_USER, 0640 | IPC_CREAT | IPC_EXCL)) == -1){
        printf("Sharing memory cannot been created!\n");
        return -1;
    }
    shared = (struct PIPE *)shmat(shm_id, NULL, 0);
    if(shared == (struct PIPE *)-1){
        printf("Cannot link sharing memory to this process!(Game server)\n");
        return -1;
    }
    if(memcpy(shared, pipes,sizeof(struct PIPE) * MAX_USER) == NULL){
        printf("Cannot set sharing memory data!\n");
        return -1;
    }

    int game_pipe[2];
    pipe(game_pipe);

    int websocket_fd = 0;

//    if(init_info(game_infor) == -1){
//        printf("Game infor inti failure!\n");
//        return -1;
//    }
    if((websocket_fd = fork()) == 0){
        if(start_websocket(WEBSOCKET_PORT, shm_id, game_pipe[1]) == -1){
            printf("Websocket server start failure!\n");
            return -1;
        }
    }

    while(true){
        char msg[MSG_MAX_SIZE];
        memset(msg, 0, MSG_MAX_SIZE);
        if(read(game_pipe[0], msg, MSG_MAX_SIZE) <= 0){
            printf("Pipe between webSocket and Game server is broken!\n");
            return -1;
        }
        if(deal_info(msg, shared) == -1){
            printf("The info:%s is illegal!\n", msg);
            continue;
        }
    }
}